

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O3

size_t tcv_get_vendor_rom_size(tcv_t *tcv)

{
  int iVar1;
  size_t sVar2;
  
  if ((tcv != (tcv_t *)0x0) && (tcv->created == true)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    if (iVar1 == 0) {
      if ((tcv->created == true) && (tcv->initialized == true)) {
        sVar2 = (*tcv->fun->get_vendor_rom_size)(tcv);
        sVar2 = (size_t)(int)sVar2;
      }
      else {
        sVar2 = 0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
      return sVar2;
    }
  }
  return 0;
}

Assistant:

size_t tcv_get_vendor_rom_size(tcv_t *tcv)
{
	int ret = 0;

	if (!tcv_check_and_lock_ok(tcv))
		return 0;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_vendor_rom_size(tcv);
	}

	tcv_unlock(tcv);
	return ret;
}